

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

void __thiscall
MovDemuxer::getTrackList
          (MovDemuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IOContextTrackType IVar2;
  Track *pTVar3;
  int iVar4;
  long lVar5;
  allocator<char> local_99;
  int local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  pair<int,_TrackInfo> local_68;
  
  iVar4 = (this->super_IOContextDemuxer).num_tracks;
  if (0 < iVar4) {
    paVar1 = &local_68.second.m_lang.field_2;
    lVar5 = 0;
    do {
      pTVar3 = (this->super_IOContextDemuxer).tracks[lVar5];
      IVar2 = pTVar3->type;
      lVar5 = lVar5 + 1;
      if (IVar2 != CONTROL) {
        local_98 = 0;
        if (IVar2 == SUBTITLE) {
          local_98 = 400;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,pTVar3->language,&local_99);
        local_70 = 0;
        local_68.first = (int)lVar5;
        local_68.second.m_trackType = local_98;
        if (local_90 == &local_80) {
          local_68.second.m_lang.field_2._8_8_ = local_80._8_8_;
          local_68.second.m_lang._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_68.second.m_lang._M_dataplus._M_p = (pointer)local_90;
        }
        local_68.second.m_lang.field_2._M_allocated_capacity._1_7_ =
             local_80._M_allocated_capacity._1_7_;
        local_68.second.m_lang.field_2._M_local_buf[0] = local_80._M_local_buf[0];
        local_68.second.m_lang._M_string_length = local_88;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_68.second.m_delay = 0;
        local_90 = &local_80;
        std::
        _Rb_tree<int,std::pair<int_const,TrackInfo>,std::_Select1st<std::pair<int_const,TrackInfo>>,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>>
        ::_M_emplace_unique<std::pair<int,TrackInfo>>
                  ((_Rb_tree<int,std::pair<int_const,TrackInfo>,std::_Select1st<std::pair<int_const,TrackInfo>>,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>>
                    *)trackList,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.second.m_lang._M_dataplus._M_p != paVar1) {
          operator_delete(local_68.second.m_lang._M_dataplus._M_p,
                          local_68.second.m_lang.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                            local_80._M_local_buf[0]) + 1);
        }
        iVar4 = (this->super_IOContextDemuxer).num_tracks;
      }
    } while (lVar5 < iVar4);
  }
  return;
}

Assistant:

void MovDemuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    for (int i = 0; i < num_tracks; i++)
    {
        if (tracks[i]->type != IOContextTrackType::CONTROL)
            trackList.insert(
                std::make_pair(i + 1, TrackInfo(tracks[i]->type == IOContextTrackType::SUBTITLE ? TRACKTYPE_SRT : 0,
                                                tracks[i]->language, 0)));
    }
}